

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O0

QPainter * __thiscall QWidgetPrivate::sharedPainter(QWidgetPrivate *this)

{
  QWidget *this_00;
  QTLWExtra *pQVar1;
  QWidgetPrivate *in_RDI;
  QTLWExtra *x;
  QWidget *q;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  QPainter *pQVar2;
  
  this_00 = q_func(in_RDI);
  QWidget::window(this_00);
  QWidget::d_func((QWidget *)0x38886e);
  pQVar1 = maybeTopData(in_stack_ffffffffffffffe0);
  if (pQVar1 == (QTLWExtra *)0x0) {
    pQVar2 = (QPainter *)0x0;
  }
  else {
    pQVar2 = pQVar1->sharedPainter;
  }
  return pQVar2;
}

Assistant:

inline QPainter *QWidgetPrivate::sharedPainter() const
{
    Q_Q(const QWidget);
    QTLWExtra *x = q->window()->d_func()->maybeTopData();
    return x ? x->sharedPainter : nullptr;
}